

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void G_WriteSnapshots(FILE *file)

{
  DWORD *this;
  undefined4 uVar1;
  uint uVar2;
  level_info_t *plVar3;
  BYTE local_c41;
  undefined1 local_c40 [7];
  BYTE pnum;
  FPNGChunkArchive arc3;
  undefined1 local_938 [7];
  SBYTE cnum;
  FPNGChunkArchive arc2;
  FString empty;
  FPNGChunkArchive *arc;
  FPNGChunkArchive arc_2;
  undefined1 local_318 [8];
  FPNGChunkArchive arc_1;
  uint i;
  FILE *file_local;
  
  arc_1.Chunk._52_4_ = 0;
  while( true ) {
    uVar1 = arc_1.Chunk._52_4_;
    uVar2 = TArray<level_info_t,_level_info_t>::Size(&wadlevelinfos);
    if (uVar2 <= (uint)uVar1) break;
    plVar3 = TArray<level_info_t,_level_info_t>::operator[]
                       (&wadlevelinfos,(ulong)(uint)arc_1.Chunk._52_4_);
    if (plVar3->snapshot != (FCompressedMemFile *)0x0) {
      FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)local_318,file,0x70416e73);
      plVar3 = TArray<level_info_t,_level_info_t>::operator[]
                         (&wadlevelinfos,(ulong)(uint)arc_1.Chunk._52_4_);
      writeSnapShot((FArchive *)local_318,plVar3);
      FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_318);
    }
    arc_1.Chunk._52_4_ = arc_1.Chunk._52_4_ + 1;
  }
  if (TheDefaultLevelInfo.snapshot != (FCompressedMemFile *)0x0) {
    FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)&arc,file,0x704e7364);
    writeSnapShot((FArchive *)&arc,&TheDefaultLevelInfo);
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)&arc);
  }
  empty.Chars = (char *)0x0;
  arc_1.Chunk._52_4_ = 0;
  while( true ) {
    uVar1 = arc_1.Chunk._52_4_;
    uVar2 = TArray<level_info_t,_level_info_t>::Size(&wadlevelinfos);
    if (uVar2 <= (uint)uVar1) break;
    plVar3 = TArray<level_info_t,_level_info_t>::operator[]
                       (&wadlevelinfos,(ulong)(uint)arc_1.Chunk._52_4_);
    if ((plVar3->flags & 0x80000000) != 0) {
      if (empty.Chars == (char *)0x0) {
        empty.Chars = (char *)operator_new(0x300);
        FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)empty.Chars,file,0x74536976);
      }
      plVar3 = TArray<level_info_t,_level_info_t>::operator[]
                         (&wadlevelinfos,(ulong)(uint)arc_1.Chunk._52_4_);
      FArchive::operator<<((FArchive *)empty.Chars,&plVar3->MapName);
    }
    arc_1.Chunk._52_4_ = arc_1.Chunk._52_4_ + 1;
  }
  if (empty.Chars != (char *)0x0) {
    this = &arc2.Chunk.m_ChunkID;
    FString::FString((FString *)this,"");
    FArchive::operator<<((FArchive *)empty.Chars,(FString *)this);
    if (empty.Chars != (char *)0x0) {
      (**(code **)(*(long *)empty.Chars + 8))();
    }
    FString::~FString((FString *)&arc2.Chunk.m_ChunkID);
  }
  if ((multiplayer & 1U) != 0) {
    FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)local_938,file,0x734c6372);
    for (arc_1.Chunk._52_4_ = 0; (uint)arc_1.Chunk._52_4_ < 8;
        arc_1.Chunk._52_4_ = arc_1.Chunk._52_4_ + 1) {
      arc3.Chunk._55_1_ = *(undefined1 *)(SinglePlayerClass + (uint)arc_1.Chunk._52_4_);
      FArchive::operator<<((FArchive *)local_938,&arc3.Chunk.field_0x37);
    }
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_938);
  }
  FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)local_c40,file,0x734c6370);
  for (arc_1.Chunk._52_4_ = 0; (uint)arc_1.Chunk._52_4_ < 8;
      arc_1.Chunk._52_4_ = arc_1.Chunk._52_4_ + 1) {
    if ((playeringame[(uint)arc_1.Chunk._52_4_] & 1U) != 0) {
      local_c41 = arc_1.Chunk._52_1_;
      FArchive::operator<<((FArchive *)local_c40,&local_c41);
      FArchive::UserWriteClass
                ((FArchive *)local_c40,
                 *(PClass **)(&DAT_00d634b0 + (ulong)(uint)arc_1.Chunk._52_4_ * 0x2a0));
    }
    local_c41 = 0xff;
    FArchive::operator<<((FArchive *)local_c40,&local_c41);
  }
  FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_c40);
  return;
}

Assistant:

void G_WriteSnapshots (FILE *file)
{
	unsigned int i;

	for (i = 0; i < wadlevelinfos.Size(); i++)
	{
		if (wadlevelinfos[i].snapshot)
		{
			FPNGChunkArchive arc (file, SNAP_ID);
			writeSnapShot (arc, (level_info_t *)&wadlevelinfos[i]);
		}
	}
	if (TheDefaultLevelInfo.snapshot != NULL)
	{
		FPNGChunkArchive arc (file, DSNP_ID);
		writeSnapShot(arc, &TheDefaultLevelInfo);
	}

	FPNGChunkArchive *arc = NULL;
	
	// Write out which levels have been visited
	for (i = 0; i < wadlevelinfos.Size(); ++i)
	{
		if (wadlevelinfos[i].flags & LEVEL_VISITED)
		{
			if (arc == NULL)
			{
				arc = new FPNGChunkArchive (file, VIST_ID);
			}
			(*arc) << wadlevelinfos[i].MapName;
		}
	}

	if (arc != NULL)
	{
		FString empty = "";
		(*arc) << empty;
		delete arc;
	}

	// Store player classes to be used when spawning a random class
	if (multiplayer)
	{
		FPNGChunkArchive arc2 (file, RCLS_ID);
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			SBYTE cnum = SinglePlayerClass[i];
			arc2 << cnum;
		}
	}

	// Store player classes that are currently in use
	FPNGChunkArchive arc3 (file, PCLS_ID);
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		BYTE pnum;
		if (playeringame[i])
		{
			pnum = i;
			arc3 << pnum;
			arc3.UserWriteClass (players[i].cls);
		}
		pnum = 255;
		arc3 << pnum;
	}
}